

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeModel::itemChanged(QTreeModel *this,QTreeWidgetItem *item)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QTreeWidgetItem *local_68;
  Data *local_58;
  QModelIndex *pQStack_50;
  QTreeWidgetItem *local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  if (0 < (int)(item->values).d.size) {
    bVar1 = this->skipPendingSort;
    this->skipPendingSort = true;
    local_48 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    index((QTreeModel *)&local_58,(char *)this,(int)item);
    local_68 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    index((QTreeModel *)&local_78,(char *)this,(int)item);
    QAbstractItemModel::dataChanged
              ((QModelIndex *)this,(QModelIndex *)&local_58,(QList_conflict *)&local_78);
    this->skipPendingSort = bVar1;
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeModel::itemChanged(QTreeWidgetItem *item)
{
    if (item->columnCount() <= 0)
        return;
    SkipSorting skipSorting(this); //this is kind of wrong, but not doing this would kill performance
    QModelIndex left = index(item, 0);
    QModelIndex right = index(item, item->columnCount() - 1);
    emit dataChanged(left, right);
}